

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorStartI4(VP8EncIterator *it)

{
  VP8Encoder *pVVar1;
  VP8EncIterator *in_RDI;
  int i;
  VP8Encoder *enc;
  int local_14;
  
  pVVar1 = in_RDI->enc_;
  in_RDI->i4_ = 0;
  in_RDI->i4_top_ = in_RDI->i4_boundary_ + 0x11;
  for (local_14 = 0; local_14 < 0x11; local_14 = local_14 + 1) {
    in_RDI->i4_boundary_[local_14] = in_RDI->y_left_[0xf - local_14];
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    in_RDI->i4_boundary_[local_14 + 0x11] = in_RDI->y_top_[local_14];
  }
  if (in_RDI->x_ < pVVar1->mb_w_ + -1) {
    for (local_14 = 0x10; local_14 < 0x14; local_14 = local_14 + 1) {
      in_RDI->i4_boundary_[local_14 + 0x11] = in_RDI->y_top_[local_14];
    }
  }
  else {
    for (local_14 = 0x10; local_14 < 0x14; local_14 = local_14 + 1) {
      in_RDI->i4_boundary_[local_14 + 0x11] = in_RDI->i4_boundary_[0x20];
    }
  }
  VP8IteratorNzToBytes(in_RDI);
  return;
}

Assistant:

void VP8IteratorStartI4(VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc_;
  int i;

  it->i4_ = 0;    // first 4x4 sub-block
  it->i4_top_ = it->i4_boundary_ + VP8TopLeftI4[0];

  // Import the boundary samples
  for (i = 0; i < 17; ++i) {    // left
    it->i4_boundary_[i] = it->y_left_[15 - i];
  }
  for (i = 0; i < 16; ++i) {    // top
    it->i4_boundary_[17 + i] = it->y_top_[i];
  }
  // top-right samples have a special case on the far right of the picture
  if (it->x_ < enc->mb_w_ - 1) {
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary_[17 + i] = it->y_top_[i];
    }
  } else {    // else, replicate the last valid pixel four times
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary_[17 + i] = it->i4_boundary_[17 + 15];
    }
  }
  VP8IteratorNzToBytes(it);  // import the non-zero context
}